

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O0

bool AreSiblings(S2CellId a,S2CellId b,S2CellId c,S2CellId d)

{
  bool bVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  uint64 uVar5;
  ulong uVar6;
  ulong uVar7;
  byte local_59;
  uint64 id_masked;
  uint64 mask;
  S2CellId d_local;
  S2CellId c_local;
  S2CellId b_local;
  S2CellId a_local;
  
  unique0x1000016d = d.id_;
  d_local = c;
  c_local = b;
  b_local = a;
  uVar2 = S2CellId::id(&b_local);
  uVar3 = S2CellId::id(&c_local);
  uVar4 = S2CellId::id(&d_local);
  uVar5 = S2CellId::id((S2CellId *)((long)&mask + 7));
  if ((uVar2 ^ uVar3 ^ uVar4) == uVar5) {
    uVar2 = S2CellId::lsb((S2CellId *)((long)&mask + 7));
    uVar6 = uVar2 * 6 ^ 0xffffffffffffffff;
    uVar2 = S2CellId::id((S2CellId *)((long)&mask + 7));
    uVar7 = uVar2 & uVar6;
    uVar2 = S2CellId::id(&b_local);
    local_59 = 0;
    if ((uVar2 & uVar6) == uVar7) {
      uVar2 = S2CellId::id(&c_local);
      local_59 = 0;
      if ((uVar2 & uVar6) == uVar7) {
        uVar2 = S2CellId::id(&d_local);
        local_59 = 0;
        if ((uVar2 & uVar6) == uVar7) {
          bVar1 = S2CellId::is_face((S2CellId *)((long)&mask + 7));
          local_59 = bVar1 ^ 0xff;
        }
      }
    }
    a_local.id_._0_1_ = (bool)(local_59 & 1);
  }
  else {
    a_local.id_._0_1_ = false;
  }
  return a_local.id_._0_1_;
}

Assistant:

inline static bool AreSiblings(S2CellId a, S2CellId b, S2CellId c, S2CellId d) {
  // A necessary (but not sufficient) condition is that the XOR of the
  // four cells must be zero.  This is also very fast to test.
  if ((a.id() ^ b.id() ^ c.id()) != d.id()) return false;

  // Now we do a slightly more expensive but exact test.  First, compute a
  // mask that blocks out the two bits that encode the child position of
  // "id" with respect to its parent, then check that the other three
  // children all agree with "mask".
  uint64 mask = d.lsb() << 1;
  mask = ~(mask + (mask << 1));
  uint64 id_masked = (d.id() & mask);
  return ((a.id() & mask) == id_masked &&
          (b.id() & mask) == id_masked &&
          (c.id() & mask) == id_masked &&
          !d.is_face());
}